

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O3

size_t __thiscall BamTools::Internal::RollingBuffer::BlockSize(RollingBuffer *this)

{
  size_t sVar1;
  
  if (this->m_tailBufferIndex == 0) {
    sVar1 = this->m_tail;
  }
  else {
    sVar1 = ByteArray::Size((this->m_data).
                            super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  return sVar1 - this->m_head;
}

Assistant:

std::size_t RollingBuffer::BlockSize() const
{

    // if only one byte array in buffer <- needed?
    if (m_tailBufferIndex == 0) {
        return m_tail - m_head;
    }

    // otherwise return remaining num bytes in first array
    const ByteArray& first = m_data.front();
    return first.Size() - m_head;
}